

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O3

int FmsMeshAddTag(FmsMesh mesh,char *tag_name,FmsTag *tag)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  FmsTag __ptr;
  char *pcVar4;
  int iVar5;
  FmsTag *local_40;
  
  if (mesh == (FmsMesh)0x0) {
    return 1;
  }
  if (tag == (FmsTag *)0x0) {
    return 2;
  }
  uVar1 = mesh->num_tags;
  local_40 = mesh->tags;
  uVar2 = 1;
  do {
    uVar3 = uVar2;
    uVar2 = uVar3 * 2;
  } while (uVar3 < uVar1 + 1);
  if (uVar3 >> 1 < uVar1) {
LAB_00105b92:
    __ptr = (FmsTag)calloc(1,0x38);
    if (__ptr == (FmsTag)0x0) {
      return 3;
    }
    iVar5 = 0;
    if (tag_name == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = strdup(tag_name);
      if (pcVar4 == (char *)0x0) {
        free(__ptr);
        goto LAB_00105bcc;
      }
    }
    __ptr->name = pcVar4;
    __ptr->tag_type = FMS_NUM_INT_TYPES;
    local_40[uVar1] = __ptr;
    mesh->num_tags = uVar1 + 1;
    *tag = __ptr;
  }
  else {
    local_40 = (FmsTag *)realloc(local_40,uVar3 << 3);
    if (local_40 != (FmsTag *)0x0) {
      mesh->tags = local_40;
      goto LAB_00105b92;
    }
LAB_00105bcc:
    iVar5 = 3;
  }
  return iVar5;
}

Assistant:

int FmsMeshAddTag(FmsMesh mesh, const char *tag_name, FmsTag *tag) {
  if (!mesh) { E_RETURN(1); }
  if (!tag) { E_RETURN(2); }
  FmsInt num_tags = mesh->num_tags;
  FmsTag *tags = mesh->tags;
  // Reallocate mesh->tags, if necessary
  FmsInt nc = NextPow2(num_tags+1);
  if (num_tags <= nc/2) {
    tags = realloc(tags, nc*sizeof(*tags));
    if (tags == NULL) { E_RETURN(3); }
    mesh->tags = tags;
  }
  FmsTag t;
  t = calloc(1, sizeof(*t));
  if (t == NULL) { E_RETURN(3); }
  // On error, call free(t)
  if (FmsCopyString(tag_name, &t->name)) { free(t); E_RETURN(3); }
  t->tag_type = FMS_NUM_INT_TYPES; // invalid type
  tags[num_tags] = t;
  mesh->num_tags = num_tags+1;
  *tag = t;
  return 0;
}